

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::ThreadSafeArena::ThreadSafeArena
          (ThreadSafeArena *this,char *mem,size_t size)

{
  size_t sVar1;
  long lVar2;
  ArenaBlock *this_00;
  char *pcVar3;
  char *pcVar4;
  uint64_t uVar5;
  long *in_FS_OFFSET;
  
  this->tag_and_id_ = 0;
  (this->alloc_policy_).policy_ = 0;
  (this->mutex_).mu_.super___atomic_base<long>._M_i = 0;
  (this->head_)._M_b._M_p = (__pointer_type)0x0;
  this_00 = FirstBlock(this,mem,size);
  (this->first_arena_).cleanup_list_.prefetch_ptr_ = (char *)0x0;
  (this->first_arena_).string_block_._M_b._M_p = (__pointer_type)0x0;
  (this->first_arena_).cleanup_list_.next_ = (CleanupNode *)0x0;
  (this->first_arena_).cleanup_list_.limit_ = (CleanupNode *)0x0;
  (this->first_arena_).prefetch_ptr_ = (char *)0x0;
  (this->first_arena_).cleanup_list_.head_ = (Chunk *)0x0;
  (this->first_arena_).ptr_._M_b._M_p = (__pointer_type)0x0;
  (this->first_arena_).limit_ = (char *)0x0;
  (this->first_arena_).string_block_unused_.super___atomic_base<unsigned_long>._M_i = 0;
  (this->first_arena_).head_._M_b._M_p = this_00;
  (this->first_arena_).space_used_.super___atomic_base<unsigned_long>._M_i = 0;
  sVar1 = this_00->size;
  (this->first_arena_).space_allocated_.super___atomic_base<unsigned_long>._M_i = sVar1;
  (this->first_arena_).parent_ = this;
  (this->first_arena_).cached_block_length_ = '\0';
  (this->first_arena_).cached_blocks_ = (CachedBlock **)0x0;
  if (sVar1 != 0) {
    pcVar3 = ArenaBlock::Pointer(this_00,0x10);
    pcVar4 = ArenaBlock::Pointer(this_00,this_00->size & 0xfffffffffffffff8);
    (this->first_arena_).ptr_._M_b._M_p = pcVar3;
    (this->first_arena_).prefetch_ptr_ = pcVar3;
    (this->first_arena_).limit_ = pcVar4;
  }
  lVar2 = *in_FS_OFFSET;
  uVar5 = in_FS_OFFSET[-0x10];
  if ((char)uVar5 == '\0') {
    LOCK();
    UNLOCK();
    uVar5 = lifecycle_id_ << 8;
    lifecycle_id_ = lifecycle_id_ + 1;
  }
  in_FS_OFFSET[-0x10] = uVar5 + 1;
  this->tag_and_id_ = uVar5;
  (this->head_)._M_b._M_p = (__pointer_type)kSentryArenaChunk;
  this->first_owner_ = (void *)(lVar2 + -0x80);
  in_FS_OFFSET[-0xe] = (long)&this->first_arena_;
  in_FS_OFFSET[-0xf] = uVar5;
  return;
}

Assistant:

ThreadSafeArena::ThreadSafeArena(char* mem, size_t size)
    : first_arena_(FirstSerialArena{}, FirstBlock(mem, size), *this) {
  Init();
}